

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

void __thiscall
pbrt::SingleLevelFlattener::SingleLevelFlattener(SingleLevelFlattener *this,SP *world)

{
  bool bVar1;
  element_type *peVar2;
  vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
  *in_RSI;
  vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
  *in_RDI;
  affine3f *in_stack_00000020;
  SP *in_stack_00000028;
  SingleLevelFlattener *in_stack_00000030;
  shared_ptr<pbrt::LightSource> lightSource;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
  *__range2;
  vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
  *in_stack_ffffffffffffff48;
  shared_ptr<pbrt::LightSource> *in_stack_ffffffffffffff50;
  value_type *__x;
  value_type local_38;
  shared_ptr<pbrt::LightSource> *local_28;
  __normal_iterator<std::shared_ptr<pbrt::LightSource>_*,_std::vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>_>
  local_20;
  vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
  *__x_00;
  
  std::make_shared<pbrt::Object>();
  std::
  map<std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
  ::map((map<std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>,_std::less<std::shared_ptr<pbrt::Object>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::Object>,_std::shared_ptr<pbrt::Object>_>_>_>
         *)0x1b7b71);
  peVar2 = std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                      )0x1b7b7b);
  __x_00 = &peVar2->lightSources;
  local_20._M_current =
       (shared_ptr<pbrt::LightSource> *)
       std::
       vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
       ::begin(in_stack_ffffffffffffff48);
  local_28 = (shared_ptr<pbrt::LightSource> *)
             std::
             vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
             ::end(in_stack_ffffffffffffff48);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<pbrt::LightSource>_*,_std::vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<std::shared_ptr<pbrt::LightSource>_*,_std::vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>_>
                        *)in_stack_ffffffffffffff48);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pbrt::LightSource>_*,_std::vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>_>
    ::operator*(&local_20);
    __x = &local_38;
    std::shared_ptr<pbrt::LightSource>::shared_ptr
              (in_stack_ffffffffffffff50,(shared_ptr<pbrt::LightSource> *)in_stack_ffffffffffffff48)
    ;
    std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1b7bf8);
    std::
    vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>
    ::push_back(in_RDI,__x);
    std::shared_ptr<pbrt::LightSource>::~shared_ptr((shared_ptr<pbrt::LightSource> *)0x1b7c18);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<pbrt::LightSource>_*,_std::vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>_>
    ::operator++(&local_20);
  }
  std::shared_ptr<pbrt::Object>::shared_ptr
            ((shared_ptr<pbrt::Object> *)in_stack_ffffffffffffff50,
             (shared_ptr<pbrt::Object> *)in_stack_ffffffffffffff48);
  math::affine3f::identity();
  traverse(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  std::shared_ptr<pbrt::Object>::~shared_ptr((shared_ptr<pbrt::Object> *)0x1b7c82);
  std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1b7c8c
            );
  std::__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<pbrt::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1b7c9f
            );
  std::
  vector<std::shared_ptr<pbrt::LightSource>,_std::allocator<std::shared_ptr<pbrt::LightSource>_>_>::
  operator=(in_RSI,__x_00);
  return;
}

Assistant:

SingleLevelFlattener(Object::SP world)
      : result(std::make_shared<Object>())
    {
      for (auto lightSource : world->lightSources)
        result->lightSources.push_back(lightSource);
      traverse(world, affine3f::identity());
      result->lightSources = world->lightSources;
    }